

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O2

InteractionReadySeat interactor_announce(Interactor *itr)

{
  Interactor *pIVar1;
  _Bool _Var2;
  undefined8 in_RAX;
  InteractionReadySeat iseat;
  Interactor *pIVar3;
  char *ptr;
  char *msg;
  char *pcVar4;
  uint level;
  
  level = (uint)((ulong)in_RAX >> 0x20);
  iseat.seat = (*itr->vt->get_seat)(itr);
  _Var2 = is_tempseat(iseat.seat);
  if (_Var2) {
    __assert_fail("!is_tempseat(seat) && \"Shouldn\'t call announce when someone else is using our seat\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/interactor.c"
                  ,0x4f,"InteractionReadySeat interactor_announce(Interactor *)");
  }
  pIVar3 = interactor_toplevel(itr,&level);
  pIVar1 = pIVar3->last_to_talk;
  if (itr->parent == (Interactor *)0x0 && pIVar1 == (Interactor *)0x0 || pIVar1 == itr) {
    return (InteractionReadySeat)iseat.seat;
  }
  if (pIVar1 != (Interactor *)0x0) {
    seat_antispoof_msg(iseat,anon_var_dwarf_3291b + 10);
  }
  ptr = (*itr->vt->description)(itr);
  if (level == 1) {
    pcVar4 = "proxy";
  }
  else {
    if (level != 0) {
      pcVar4 = dupprintf("proxy^%u");
      goto LAB_001430b7;
    }
    pcVar4 = "primary";
  }
  pcVar4 = dupstr(pcVar4);
LAB_001430b7:
  msg = dupprintf("%sMaking %s %s",anon_var_dwarf_3291b + 10,pcVar4,ptr);
  safefree(pcVar4);
  safefree(ptr);
  seat_antispoof_msg(iseat,msg);
  safefree(msg);
  pIVar3->last_to_talk = itr;
  return (InteractionReadySeat)iseat.seat;
}

Assistant:

InteractionReadySeat interactor_announce(Interactor *itr)
{
    Seat *seat = interactor_get_seat(itr);
    assert(!is_tempseat(seat) &&
           "Shouldn't call announce when someone else is using our seat");

    InteractionReadySeat iseat;
    iseat.seat = seat;

    unsigned level;
    Interactor *itr_top = interactor_toplevel(itr, &level);

    /*
     * Generally, we should announce ourself if the previous
     * Interactor that said anything was not us. That includes if
     * there was no previous Interactor to talk (i.e. if we're the
     * first to say anything) - *except* that the primary Interactor
     * doesn't need to announce itself, if no proxy has intervened
     * before it.
     */
    bool need_announcement = (itr_top->last_to_talk != itr);
    if (!itr->parent && !itr_top->last_to_talk)
        need_announcement = false;

    if (need_announcement) {
        const char *prefix = "";
        if (itr_top->last_to_talk != NULL)
            seat_antispoof_msg(iseat, ""); /* leave a separating blank line */

        char *desc = interactor_description(itr);
        char *adjective = (level == 0 ? dupstr("primary") :
                           level == 1 ? dupstr("proxy") :
                           dupprintf("proxy^%u", level));
        char *msg = dupprintf("%sMaking %s %s", prefix, adjective, desc);
        sfree(adjective);
        sfree(desc);

        seat_antispoof_msg(iseat, msg);
        sfree(msg);

        itr_top->last_to_talk = itr;
    }

    return iseat;
}